

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O0

Var Js::IntlEngineInterfaceExtensionObject::EntryIntl_GetLocaleData
              (RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  UBool UVar3;
  int iVar4;
  CallFlags e;
  uint uVar5;
  uint32 length;
  ScriptContext *pSVar6;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar7;
  JavascriptString *pJVar8;
  JavascriptLibrary *this_00;
  UEnumeration *pUVar9;
  LPCSTR pCVar10;
  JavascriptArray *pJVar11;
  RecyclableObject *pRVar12;
  char *pcVar13;
  Recycler *pRVar14;
  UCollator *pUVar15;
  JavascriptString *pJVar16;
  size_t sVar17;
  UNumberingSystem *pUVar18;
  char16_t *content;
  double dVar19;
  int32 local_2c4;
  int i_3;
  int i_2;
  undefined1 local_2a0 [8];
  NarrowToWide numsysName;
  ScopedUNumberingSystem numsys;
  HRESULT hr_1;
  charcount_t unicodeCalendar16Len;
  TrackAllocData local_260;
  char16_t *local_238;
  char16 *unicodeCalendar16;
  size_t unicodeCalendarLen;
  char *unicodeCalendar;
  long lStack_218;
  int i_1;
  char *calendar;
  int calendarLen;
  ScopedUEnumeration calendars;
  JavascriptString *trueStr;
  JavascriptString *falseStr_1;
  UColAttributeValue kn;
  ScopedUCollator collator_1;
  JavascriptString *lowerStr;
  JavascriptString *upperStr;
  JavascriptString *falseStr;
  UColAttributeValue kf;
  ScopedUCollator collator;
  HRESULT hr;
  charcount_t unicodeCollation16Len;
  TrackAllocData local_1a0;
  char16_t *local_178;
  char16 *unicodeCollation16;
  size_t unicodeCollationLen;
  char *unicodeCollation;
  char *pcStack_158;
  int i;
  char *collation;
  int collationLen;
  int local_13c;
  int collationsCount;
  ScopedUEnumeration collations;
  PropertyOperationFlags flag;
  JavascriptLibrary *library;
  JavascriptString *langtag;
  char localeID [157];
  UErrorCode local_6c;
  JavascriptArray *pJStack_68;
  UErrorCode status;
  JavascriptArray *ret;
  ScriptContext *pSStack_58;
  LocaleDataKind kind;
  ScriptContext *scriptContext;
  CallInfo CStack_48;
  uint argCount;
  undefined1 local_40 [8];
  Arguments args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  pSVar6 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar6);
  pSVar6 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar6,(PVOID)0x0);
  iVar4 = _count_args(callInfo);
  values = _get_va(&stack0x00000000,iVar4);
  args.Values = (Type)callInfo;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),callInfo);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,1099,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  CStack_48 = callInfo;
  Arguments::Arguments((Arguments *)local_40,callInfo,values);
  e = Js::operator&(callInfo._3_4_ &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar2 = operator!(e);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,1099,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  scriptContext._4_4_ = local_40._0_4_ & 0xffffff;
  pSStack_58 = RecyclableObject::GetScriptContext(function);
  if (scriptContext._4_4_ == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,1099,"(argCount > 0)","Should always have implicit \'this\'");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if (((local_40._0_4_ & 0xffffff) != 3) ||
     (((bVar2 = JavascriptNumber::Is(*(Var *)((long)args.Info + 8)), !bVar2 &&
       (bVar2 = TaggedInt::Is(*(Var *)((long)args.Info + 8)), !bVar2)) ||
      (bVar2 = VarIs<Js::JavascriptString>(*(Var *)((long)args.Info + 0x10)), !bVar2)))) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x450,
                                "((args.Info.Count == 3 && (JavascriptNumber::Is(args.Values[1]) || TaggedInt::Is(args.Values[1])) && VarIs<JavascriptString>(args.Values[2])))"
                                ,"Intl platform function given bad arguments");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  bVar2 = TaggedInt::Is(*(Var *)((long)args.Info + 8));
  if (bVar2) {
    local_2c4 = TaggedInt::ToInt32(*(Var *)((long)args.Info + 8));
  }
  else {
    dVar19 = JavascriptNumber::GetValue(*(Var *)((long)args.Info + 8));
    local_2c4 = (int32)dVar19;
  }
  ret._4_4_ = local_2c4;
  pJStack_68 = (JavascriptArray *)0x0;
  local_6c = U_ZERO_ERROR;
  memset(&langtag,0,0x9d);
  pJVar8 = UnsafeVarTo<Js::JavascriptString>(*(Var *)((long)args.Info + 0x10));
  LangtagToLocaleID<157ul>(pJVar8,(char (*) [157])&langtag);
  this_00 = ScriptContext::GetLibrary(pSStack_58);
  collations.object._4_4_ = 0;
  if (ret._4_4_ == 0) {
    pUVar9 = (UEnumeration *)ucol_getKeywordValuesForLocale_70("collation",&langtag,0,&local_6c);
    PlatformAgnostic::ICUHelpers::ScopedICUObject<UEnumeration_*,_&uenum_close_70>::ScopedICUObject
              ((ScopedICUObject<UEnumeration_*,_&uenum_close_70> *)&stack0xfffffffffffffec8,pUVar9);
    pUVar9 = PlatformAgnostic::ICUHelpers::ScopedICUObject::operator_cast_to_UEnumeration_
                       ((ScopedICUObject *)&stack0xfffffffffffffec8);
    local_13c = uenum_count_70(pUVar9,&local_6c);
    if (local_6c == U_MEMORY_ALLOCATION_ERROR) {
      Throw::OutOfMemory();
    }
    UVar3 = U_FAILURE(local_6c);
    if ((UVar3 == '\0') && (local_6c != U_STRING_NOT_TERMINATED_WARNING)) {
      if ((local_13c < 3) && (local_13c < 3)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                    ,0x466,"(collationsCount > 2)","collationsCount > 2");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      pCVar10 = (LPCSTR)u_errorName_70(local_6c);
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x466,"(false)",pCVar10);
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    pJVar11 = JavascriptLibrary::CreateArray(this_00,local_13c - 1);
    pJStack_68 = pJVar11;
    pRVar12 = JavascriptLibraryBase::GetNull(&this_00->super_JavascriptLibraryBase);
    (*(pJVar11->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar11,0,pRVar12,(ulong)collations.object._4_4_);
    collation._0_4_ = 0;
    pcStack_158 = (char *)0x0;
    unicodeCollation._4_4_ = 0;
    pUVar9 = PlatformAgnostic::ICUHelpers::ScopedICUObject::operator_cast_to_UEnumeration_
                       ((ScopedICUObject *)&stack0xfffffffffffffec8);
    pcStack_158 = (char *)uenum_next_70(pUVar9,&collation,&local_6c);
    while (pcStack_158 != (char *)0x0) {
      if (local_6c == U_MEMORY_ALLOCATION_ERROR) {
        Throw::OutOfMemory();
      }
      UVar3 = U_FAILURE(local_6c);
      if ((UVar3 == '\0') && (local_6c != U_STRING_NOT_TERMINATED_WARNING)) {
        if (((pcStack_158 == (char *)0x0) || ((int)collation < 1)) &&
           ((pcStack_158 == (char *)0x0 || ((int)collation < 1)))) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                      ,0x471,"(collation != nullptr && collationLen > 0)",
                                      "collation != nullptr && collationLen > 0");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
      }
      else {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        pCVar10 = (LPCSTR)u_errorName_70(local_6c);
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                    ,0x471,"(false)",pCVar10);
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      iVar4 = strcmp(pcStack_158,"standard");
      if ((iVar4 != 0) && (iVar4 = strcmp(pcStack_158,"search"), iVar4 != 0)) {
        pcVar13 = (char *)uloc_toUnicodeLocaleType_70("collation",pcStack_158);
        unicodeCollationLen = (size_t)ThrowOOMIfNull<char_const*>(pcVar13);
        unicodeCollation16 = (char16 *)strlen((char *)unicodeCollationLen);
        pRVar14 = ScriptContext::GetRecycler(pSStack_58);
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_1a0,(type_info *)&char16_t::typeinfo,0,(long)unicodeCollation16 + 1,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                   ,0x47d);
        pRVar14 = Memory::Recycler::TrackAllocInfo(pRVar14,&local_1a0);
        local_178 = Memory::AllocateArray<Memory::Recycler,char16_t,false>
                              ((Memory *)pRVar14,(Recycler *)Memory::Recycler::AllocLeaf,0,
                               (long)unicodeCollation16 + 1);
        collator.object._4_4_ = 0;
        collator.object._0_4_ =
             utf8::NarrowStringToWideNoAlloc
                       ((LPCSTR)unicodeCollationLen,(size_t)unicodeCollation16,local_178,
                        (long)unicodeCollation16 + 1,(charcount_t *)((long)&collator.object + 4));
        if (((HRESULT)collator.object != 0) ||
           (((char16 *)(ulong)collator.object._4_4_ != unicodeCollation16 ||
            (0x7ffffffd < collator.object._4_4_)))) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                      ,0x489,
                                      "(hr == ((HRESULT)0x00000000L) && unicodeCollation16Len == unicodeCollationLen && unicodeCollation16Len < MaxCharCount)"
                                      ,"Unicode collation char16 conversion was unsuccessful");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
        pJVar11 = pJStack_68;
        uVar5 = unicodeCollation._4_4_ + 1;
        pJVar8 = JavascriptString::NewWithBuffer(local_178,collator.object._4_4_,pSStack_58);
        (*(pJVar11->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
          super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                  (pJVar11,(ulong)uVar5,pJVar8,0);
        unicodeCollation._4_4_ = unicodeCollation._4_4_ + 1;
      }
      pUVar9 = PlatformAgnostic::ICUHelpers::ScopedICUObject::operator_cast_to_UEnumeration_
                         ((ScopedICUObject *)&stack0xfffffffffffffec8);
      pcStack_158 = (char *)uenum_next_70(pUVar9,&collation,&local_6c);
    }
    PlatformAgnostic::ICUHelpers::ScopedICUObject<UEnumeration_*,_&uenum_close_70>::~ScopedICUObject
              ((ScopedICUObject<UEnumeration_*,_&uenum_close_70> *)&stack0xfffffffffffffec8);
  }
  else if (ret._4_4_ == 1) {
    pUVar15 = (UCollator *)ucol_open_70(&langtag,&local_6c);
    PlatformAgnostic::ICUHelpers::ScopedICUObject<UCollator_*,_&ucol_close_70>::ScopedICUObject
              ((ScopedICUObject<UCollator_*,_&ucol_close_70> *)&stack0xfffffffffffffe40,pUVar15);
    pUVar15 = PlatformAgnostic::ICUHelpers::ScopedICUObject::operator_cast_to_UCollator_
                        ((ScopedICUObject *)&stack0xfffffffffffffe40);
    iVar4 = ucol_getAttribute_70(pUVar15,2,&local_6c);
    if (local_6c == U_MEMORY_ALLOCATION_ERROR) {
      Throw::OutOfMemory();
    }
    UVar3 = U_FAILURE(local_6c);
    if ((UVar3 != '\0') || (local_6c == U_STRING_NOT_TERMINATED_WARNING)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      pCVar10 = (LPCSTR)u_errorName_70(local_6c);
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x497,"(false)",pCVar10);
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    pJStack_68 = JavascriptLibrary::CreateArray(this_00,3);
    pJVar8 = JavascriptLibrary::GetFalseDisplayString(this_00);
    pJVar16 = JavascriptLibrary::GetIntlCaseFirstUpperString(this_00);
    collator_1.object = (UCollator *)JavascriptLibrary::GetIntlCaseFirstLowerString(this_00);
    if (iVar4 == 0x10) {
      (*(pJStack_68->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
        super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                (pJStack_68,0,pJVar8,(ulong)collations.object._4_4_);
      (*(pJStack_68->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
        super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                (pJStack_68,1,pJVar16,(ulong)collations.object._4_4_);
      (*(pJStack_68->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
        super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                (pJStack_68,2,collator_1.object,(ulong)collations.object._4_4_);
    }
    else if (iVar4 == 0x19) {
      (*(pJStack_68->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
        super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                (pJStack_68,0,pJVar16,(ulong)collations.object._4_4_);
      (*(pJStack_68->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
        super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                (pJStack_68,1,collator_1.object,(ulong)collations.object._4_4_);
      (*(pJStack_68->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
        super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                (pJStack_68,2,pJVar8,(ulong)collations.object._4_4_);
    }
    else if (iVar4 == 0x18) {
      (*(pJStack_68->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
        super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                (pJStack_68,0,collator_1.object,(ulong)collations.object._4_4_);
      (*(pJStack_68->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
        super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                (pJStack_68,1,pJVar16,(ulong)collations.object._4_4_);
      (*(pJStack_68->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
        super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                (pJStack_68,2,pJVar8,(ulong)collations.object._4_4_);
    }
    PlatformAgnostic::ICUHelpers::ScopedICUObject<UCollator_*,_&ucol_close_70>::~ScopedICUObject
              ((ScopedICUObject<UCollator_*,_&ucol_close_70> *)&stack0xfffffffffffffe40);
  }
  else if (ret._4_4_ == 2) {
    pUVar15 = (UCollator *)ucol_open_70(&langtag,&local_6c);
    PlatformAgnostic::ICUHelpers::ScopedICUObject<UCollator_*,_&ucol_close_70>::ScopedICUObject
              ((ScopedICUObject<UCollator_*,_&ucol_close_70> *)&stack0xfffffffffffffe18,pUVar15);
    pUVar15 = PlatformAgnostic::ICUHelpers::ScopedICUObject::operator_cast_to_UCollator_
                        ((ScopedICUObject *)&stack0xfffffffffffffe18);
    iVar4 = ucol_getAttribute_70(pUVar15,7,&local_6c);
    if (local_6c == U_MEMORY_ALLOCATION_ERROR) {
      Throw::OutOfMemory();
    }
    UVar3 = U_FAILURE(local_6c);
    if ((UVar3 != '\0') || (local_6c == U_STRING_NOT_TERMINATED_WARNING)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      pCVar10 = (LPCSTR)u_errorName_70(local_6c);
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x4b5,"(false)",pCVar10);
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    pJStack_68 = JavascriptLibrary::CreateArray(this_00,2);
    pJVar8 = JavascriptLibrary::GetFalseDisplayString(this_00);
    calendars.object = (UEnumeration *)JavascriptLibrary::GetTrueDisplayString(this_00);
    if (iVar4 == 0x10) {
      (*(pJStack_68->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
        super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                (pJStack_68,0,pJVar8,(ulong)collations.object._4_4_);
      (*(pJStack_68->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
        super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                (pJStack_68,1,calendars.object,(ulong)collations.object._4_4_);
    }
    else if (iVar4 == 0x11) {
      (*(pJStack_68->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
        super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                (pJStack_68,0,calendars.object,(ulong)collations.object._4_4_);
      (*(pJStack_68->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
        super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                (pJStack_68,1,pJVar8,(ulong)collations.object._4_4_);
    }
    PlatformAgnostic::ICUHelpers::ScopedICUObject<UCollator_*,_&ucol_close_70>::~ScopedICUObject
              ((ScopedICUObject<UCollator_*,_&ucol_close_70> *)&stack0xfffffffffffffe18);
  }
  else if (ret._4_4_ == 3) {
    pUVar9 = (UEnumeration *)ucal_getKeywordValuesForLocale_70("calendar",&langtag,0,&local_6c);
    PlatformAgnostic::ICUHelpers::ScopedICUObject<UEnumeration_*,_&uenum_close_70>::ScopedICUObject
              ((ScopedICUObject<UEnumeration_*,_&uenum_close_70> *)&stack0xfffffffffffffdf8,pUVar9);
    pUVar9 = PlatformAgnostic::ICUHelpers::ScopedICUObject::operator_cast_to_UEnumeration_
                       ((ScopedICUObject *)&stack0xfffffffffffffdf8);
    length = uenum_count_70(pUVar9,&local_6c);
    pJStack_68 = JavascriptLibrary::CreateArray(this_00,length);
    if (local_6c == U_MEMORY_ALLOCATION_ERROR) {
      Throw::OutOfMemory();
    }
    UVar3 = U_FAILURE(local_6c);
    if ((UVar3 != '\0') || (local_6c == U_STRING_NOT_TERMINATED_WARNING)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      pCVar10 = (LPCSTR)u_errorName_70(local_6c);
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x4ca,"(false)",pCVar10);
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    calendar._4_4_ = 0;
    lStack_218 = 0;
    unicodeCalendar._4_4_ = 0;
    pUVar9 = PlatformAgnostic::ICUHelpers::ScopedICUObject::operator_cast_to_UEnumeration_
                       ((ScopedICUObject *)&stack0xfffffffffffffdf8);
    lStack_218 = uenum_next_70(pUVar9,(long)&calendar + 4,&local_6c);
    while (lStack_218 != 0) {
      if (local_6c == U_MEMORY_ALLOCATION_ERROR) {
        Throw::OutOfMemory();
      }
      UVar3 = U_FAILURE(local_6c);
      if ((UVar3 == '\0') && (local_6c != U_STRING_NOT_TERMINATED_WARNING)) {
        if (((lStack_218 == 0) || (calendar._4_4_ < 1)) &&
           ((lStack_218 == 0 || (calendar._4_4_ < 1)))) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                      ,0x4d1,"(calendar != nullptr && calendarLen > 0)",
                                      "calendar != nullptr && calendarLen > 0");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
      }
      else {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        pCVar10 = (LPCSTR)u_errorName_70(local_6c);
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                    ,0x4d1,"(false)",pCVar10);
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      pcVar13 = (char *)uloc_toUnicodeLocaleType_70("calendar",lStack_218);
      unicodeCalendarLen = (size_t)ThrowOOMIfNull<char_const*>(pcVar13);
      unicodeCalendar16 = (char16 *)strlen((char *)unicodeCalendarLen);
      pRVar14 = ScriptContext::GetRecycler(pSStack_58);
      sVar17 = strlen((char *)unicodeCalendarLen);
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_260,(type_info *)&char16_t::typeinfo,0,sVar17 + 1,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                 ,0x4d8);
      pRVar14 = Memory::Recycler::TrackAllocInfo(pRVar14,&local_260);
      sVar17 = strlen((char *)unicodeCalendarLen);
      local_238 = Memory::AllocateArray<Memory::Recycler,char16_t,false>
                            ((Memory *)pRVar14,(Recycler *)Memory::Recycler::AllocLeaf,0,sVar17 + 1)
      ;
      numsys.object._4_4_ = 0;
      numsys.object._0_4_ =
           utf8::NarrowStringToWideNoAlloc
                     ((LPCSTR)unicodeCalendarLen,(size_t)unicodeCalendar16,local_238,
                      (long)unicodeCalendar16 + 1,(charcount_t *)((long)&numsys.object + 4));
      if ((((HRESULT)numsys.object != 0) ||
          ((char16 *)(ulong)numsys.object._4_4_ != unicodeCalendar16)) ||
         (0x7ffffffd < numsys.object._4_4_)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                    ,0x4e4,
                                    "(hr == ((HRESULT)0x00000000L) && unicodeCalendar16Len == unicodeCalendarLen && unicodeCalendar16Len < MaxCharCount)"
                                    ,"Unicode calendar char16 conversion was unsuccessful");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      pJVar11 = pJStack_68;
      uVar5 = unicodeCalendar._4_4_;
      pJVar8 = JavascriptString::NewWithBuffer(local_238,numsys.object._4_4_,pSStack_58);
      (*(pJVar11->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
        super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                (pJVar11,(ulong)uVar5,pJVar8,(ulong)collations.object._4_4_);
      unicodeCalendar._4_4_ = unicodeCalendar._4_4_ + 1;
      pUVar9 = PlatformAgnostic::ICUHelpers::ScopedICUObject::operator_cast_to_UEnumeration_
                         ((ScopedICUObject *)&stack0xfffffffffffffdf8);
      lStack_218 = uenum_next_70(pUVar9,(long)&calendar + 4,&local_6c);
    }
    PlatformAgnostic::ICUHelpers::ScopedICUObject<UEnumeration_*,_&uenum_close_70>::~ScopedICUObject
              ((ScopedICUObject<UEnumeration_*,_&uenum_close_70> *)&stack0xfffffffffffffdf8);
  }
  else if (ret._4_4_ == 4) {
    pUVar18 = (UNumberingSystem *)unumsys_open_70(&langtag,&local_6c);
    PlatformAgnostic::ICUHelpers::ScopedICUObject<UNumberingSystem_*,_&unumsys_close_70>::
    ScopedICUObject((ScopedICUObject<UNumberingSystem_*,_&unumsys_close_70> *)&numsysName.freeDst,
                    pUVar18);
    if (local_6c == U_MEMORY_ALLOCATION_ERROR) {
      Throw::OutOfMemory();
    }
    UVar3 = U_FAILURE(local_6c);
    if ((UVar3 != '\0') || (local_6c == U_STRING_NOT_TERMINATED_WARNING)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      pCVar10 = (LPCSTR)u_errorName_70(local_6c);
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x4f5,"(false)",pCVar10);
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    pUVar18 = PlatformAgnostic::ICUHelpers::ScopedICUObject::operator_cast_to_UNumberingSystem_
                        ((ScopedICUObject *)&numsysName.freeDst);
    _i_3 = (char *)unumsys_getName_70(pUVar18);
    utf8::NarrowWideConverter<utf8::malloc_allocator,_const_char_*,_char16_t_*,_unsigned_int>::
    NarrowWideConverter((NarrowWideConverter<utf8::malloc_allocator,_const_char_*,_char16_t_*,_unsigned_int>
                         *)local_2a0,(char **)&i_3,0xffffffffffffffff);
    pJVar11 = JavascriptLibrary::CreateArray(this_00,0x16);
    pJStack_68 = pJVar11;
    content = utf8::NarrowWideConverter::operator_cast_to_char16_t_
                        ((NarrowWideConverter *)local_2a0);
    pJVar8 = JavascriptString::NewCopySz(content,pSStack_58);
    (*(pJVar11->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar11,0,pJVar8,(ulong)collations.object._4_4_);
    pJVar11 = pJStack_68;
    pJVar8 = JavascriptLibrary::GetIntlNumsysArabString(this_00);
    (*(pJVar11->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar11,1,pJVar8,(ulong)collations.object._4_4_);
    pJVar11 = pJStack_68;
    pJVar8 = JavascriptLibrary::GetIntlNumsysArabextString(this_00);
    (*(pJVar11->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar11,2,pJVar8,(ulong)collations.object._4_4_);
    pJVar11 = pJStack_68;
    pJVar8 = JavascriptLibrary::GetIntlNumsysBaliString(this_00);
    (*(pJVar11->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar11,3,pJVar8,(ulong)collations.object._4_4_);
    pJVar11 = pJStack_68;
    pJVar8 = JavascriptLibrary::GetIntlNumsysBengString(this_00);
    (*(pJVar11->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar11,4,pJVar8,(ulong)collations.object._4_4_);
    pJVar11 = pJStack_68;
    pJVar8 = JavascriptLibrary::GetIntlNumsysDevaString(this_00);
    (*(pJVar11->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar11,5,pJVar8,(ulong)collations.object._4_4_);
    pJVar11 = pJStack_68;
    pJVar8 = JavascriptLibrary::GetIntlNumsysFullwideString(this_00);
    (*(pJVar11->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar11,6,pJVar8,(ulong)collations.object._4_4_);
    pJVar11 = pJStack_68;
    pJVar8 = JavascriptLibrary::GetIntlNumsysGujrString(this_00);
    (*(pJVar11->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar11,7,pJVar8,(ulong)collations.object._4_4_);
    pJVar11 = pJStack_68;
    pJVar8 = JavascriptLibrary::GetIntlNumsysGuruString(this_00);
    (*(pJVar11->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar11,8,pJVar8,(ulong)collations.object._4_4_);
    pJVar11 = pJStack_68;
    pJVar8 = JavascriptLibrary::GetIntlNumsysHanidecString(this_00);
    (*(pJVar11->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar11,9,pJVar8,(ulong)collations.object._4_4_);
    pJVar11 = pJStack_68;
    pJVar8 = JavascriptLibrary::GetIntlNumsysKhmrString(this_00);
    (*(pJVar11->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar11,10,pJVar8,(ulong)collations.object._4_4_);
    pJVar11 = pJStack_68;
    pJVar8 = JavascriptLibrary::GetIntlNumsysKndaString(this_00);
    (*(pJVar11->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar11,0xb,pJVar8,(ulong)collations.object._4_4_);
    pJVar11 = pJStack_68;
    pJVar8 = JavascriptLibrary::GetIntlNumsysLaooString(this_00);
    (*(pJVar11->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar11,0xc,pJVar8,(ulong)collations.object._4_4_);
    pJVar11 = pJStack_68;
    pJVar8 = JavascriptLibrary::GetIntlNumsysLatnString(this_00);
    (*(pJVar11->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar11,0xd,pJVar8,(ulong)collations.object._4_4_);
    pJVar11 = pJStack_68;
    pJVar8 = JavascriptLibrary::GetIntlNumsysLimbString(this_00);
    (*(pJVar11->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar11,0xe,pJVar8,(ulong)collations.object._4_4_);
    pJVar11 = pJStack_68;
    pJVar8 = JavascriptLibrary::GetIntlNumsysMlymString(this_00);
    (*(pJVar11->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar11,0xf,pJVar8,(ulong)collations.object._4_4_);
    pJVar11 = pJStack_68;
    pJVar8 = JavascriptLibrary::GetIntlNumsysMongString(this_00);
    (*(pJVar11->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar11,0x10,pJVar8,(ulong)collations.object._4_4_);
    pJVar11 = pJStack_68;
    pJVar8 = JavascriptLibrary::GetIntlNumsysMymrString(this_00);
    (*(pJVar11->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar11,0x11,pJVar8,(ulong)collations.object._4_4_);
    pJVar11 = pJStack_68;
    pJVar8 = JavascriptLibrary::GetIntlNumsysOryaString(this_00);
    (*(pJVar11->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar11,0x12,pJVar8,(ulong)collations.object._4_4_);
    pJVar11 = pJStack_68;
    pJVar8 = JavascriptLibrary::GetIntlNumsysTamldecString(this_00);
    (*(pJVar11->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar11,0x13,pJVar8,(ulong)collations.object._4_4_);
    pJVar11 = pJStack_68;
    pJVar8 = JavascriptLibrary::GetIntlNumsysTeluString(this_00);
    (*(pJVar11->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar11,0x14,pJVar8,(ulong)collations.object._4_4_);
    pJVar11 = pJStack_68;
    pJVar8 = JavascriptLibrary::GetIntlNumsysThaiString(this_00);
    (*(pJVar11->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar11,0x15,pJVar8,(ulong)collations.object._4_4_);
    pJVar11 = pJStack_68;
    pJVar8 = JavascriptLibrary::GetIntlNumsysTibtString(this_00);
    (*(pJVar11->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar11,0x16,pJVar8,(ulong)collations.object._4_4_);
    utf8::NarrowWideConverter<utf8::malloc_allocator,_const_char_*,_char16_t_*,_unsigned_int>::
    ~NarrowWideConverter
              ((NarrowWideConverter<utf8::malloc_allocator,_const_char_*,_char16_t_*,_unsigned_int>
                *)local_2a0);
    PlatformAgnostic::ICUHelpers::ScopedICUObject<UNumberingSystem_*,_&unumsys_close_70>::
    ~ScopedICUObject((ScopedICUObject<UNumberingSystem_*,_&unumsys_close_70> *)&numsysName.freeDst);
  }
  else if (ret._4_4_ == 5) {
    pJVar11 = JavascriptLibrary::CreateArray(this_00,5);
    pJStack_68 = pJVar11;
    pRVar12 = JavascriptLibraryBase::GetNull(&this_00->super_JavascriptLibraryBase);
    (*(pJVar11->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar11,0,pRVar12,(ulong)collations.object._4_4_);
    pJVar11 = pJStack_68;
    pJVar8 = JavascriptLibrary::GetIntlHourCycle11String(this_00);
    (*(pJVar11->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar11,1,pJVar8,(ulong)collations.object._4_4_);
    pJVar11 = pJStack_68;
    pJVar8 = JavascriptLibrary::GetIntlHourCycle12String(this_00);
    (*(pJVar11->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar11,2,pJVar8,(ulong)collations.object._4_4_);
    pJVar11 = pJStack_68;
    pJVar8 = JavascriptLibrary::GetIntlHourCycle23String(this_00);
    (*(pJVar11->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar11,3,pJVar8,(ulong)collations.object._4_4_);
    pJVar11 = pJStack_68;
    pJVar8 = JavascriptLibrary::GetIntlHourCycle24String(this_00);
    (*(pJVar11->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar11,4,pJVar8,(ulong)collations.object._4_4_);
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x523,"(false)","GetLocaleData called with unknown kind parameter")
    ;
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  return pJStack_68;
}

Assistant:

Var IntlEngineInterfaceExtensionObject::EntryIntl_GetLocaleData(RecyclableObject* function, CallInfo callInfo, ...)
    {
#ifdef INTL_ICU
        EngineInterfaceObject_CommonFunctionProlog(function, callInfo);
        INTL_CHECK_ARGS(
            args.Info.Count == 3 &&
            (JavascriptNumber::Is(args.Values[1]) || TaggedInt::Is(args.Values[1])) &&
            VarIs<JavascriptString>(args.Values[2])
        );

        LocaleDataKind kind = (LocaleDataKind) (TaggedInt::Is(args.Values[1])
            ? TaggedInt::ToInt32(args.Values[1])
            : (int) JavascriptNumber::GetValue(args.Values[1]));

        JavascriptArray *ret = nullptr;

        UErrorCode status = U_ZERO_ERROR;
        char localeID[ULOC_FULLNAME_CAPACITY] = { 0 };
        JavascriptString *langtag = UnsafeVarTo<JavascriptString>(args.Values[2]);
        LangtagToLocaleID(langtag, localeID);

        JavascriptLibrary *library = scriptContext->GetLibrary();
        PropertyOperationFlags flag = PropertyOperationFlags::PropertyOperation_None;

        if (kind == LocaleDataKind::Collation)
        {
            ScopedUEnumeration collations(ucol_getKeywordValuesForLocale("collation", localeID, false, &status));
            int collationsCount = uenum_count(collations, &status);

            // we expect collationsCount to have at least "standard" and "search" in it
            ICU_ASSERT(status, collationsCount > 2);

            // the return array can't include "standard" and "search", but must have its first element be null (count - 2 + 1) [#sec-intl-collator-internal-slots]
            ret = library->CreateArray(collationsCount - 1);
            ret->SetItem(0, library->GetNull(), flag);

            int collationLen = 0;
            const char *collation = nullptr;
            int i = 0;
            for (collation = uenum_next(collations, &collationLen, &status); collation != nullptr; collation = uenum_next(collations, &collationLen, &status))
            {
                ICU_ASSERT(status, collation != nullptr && collationLen > 0);
                if (strcmp(collation, "standard") == 0 || strcmp(collation, "search") == 0)
                {
                    // continue does not create holes in ret because i is set outside the loop
                    continue;
                }

                // OS#17172584: OOM during uloc_toUnicodeLocaleType can make this return nullptr even for known collations
                const char *unicodeCollation = ThrowOOMIfNull(uloc_toUnicodeLocaleType("collation", collation));
                const size_t unicodeCollationLen = strlen(unicodeCollation);

                // we only need strlen(unicodeCollation) + 1 char16s because unicodeCollation will always be ASCII (funnily enough)
                char16 *unicodeCollation16 = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), char16, unicodeCollationLen + 1);
                charcount_t unicodeCollation16Len = 0;
                HRESULT hr = utf8::NarrowStringToWideNoAlloc(
                    unicodeCollation,
                    unicodeCollationLen,
                    unicodeCollation16,
                    unicodeCollationLen + 1,
                    &unicodeCollation16Len
                );
                AssertOrFailFastMsg(
                    hr == S_OK && unicodeCollation16Len == unicodeCollationLen && unicodeCollation16Len < MaxCharCount,
                    "Unicode collation char16 conversion was unsuccessful"
                );
                // i + 1 to not overwrite leading null element
                ret->SetItem(i + 1, JavascriptString::NewWithBuffer(
                    unicodeCollation16,
                    unicodeCollation16Len,
                    scriptContext
                ), PropertyOperationFlags::PropertyOperation_None);
                i++;
            }
        }
        else if (kind == LocaleDataKind::CaseFirst)
        {
            ScopedUCollator collator(ucol_open(localeID, &status));
            UColAttributeValue kf = ucol_getAttribute(collator, UCOL_CASE_FIRST, &status);
            ICU_ASSERT(status, true);
            ret = library->CreateArray(3);

            JavascriptString *falseStr = library->GetFalseDisplayString();
            JavascriptString *upperStr = library->GetIntlCaseFirstUpperString();
            JavascriptString *lowerStr = library->GetIntlCaseFirstLowerString();

            if (kf == UCOL_OFF)
            {
                ret->SetItem(0, falseStr, flag);
                ret->SetItem(1, upperStr, flag);
                ret->SetItem(2, lowerStr, flag);
            }
            else if (kf == UCOL_UPPER_FIRST)
            {
                ret->SetItem(0, upperStr, flag);
                ret->SetItem(1, lowerStr, flag);
                ret->SetItem(2, falseStr, flag);
            }
            else if (kf == UCOL_LOWER_FIRST)
            {
                ret->SetItem(0, lowerStr, flag);
                ret->SetItem(1, upperStr, flag);
                ret->SetItem(2, falseStr, flag);
            }
        }
        else if (kind == LocaleDataKind::Numeric)
        {
            ScopedUCollator collator(ucol_open(localeID, &status));
            UColAttributeValue kn = ucol_getAttribute(collator, UCOL_NUMERIC_COLLATION, &status);
            ICU_ASSERT(status, true);
            ret = library->CreateArray(2);

            JavascriptString *falseStr = library->GetFalseDisplayString();
            JavascriptString *trueStr = library->GetTrueDisplayString();

            if (kn == UCOL_OFF)
            {
                ret->SetItem(0, falseStr, flag);
                ret->SetItem(1, trueStr, flag);
            }
            else if (kn == UCOL_ON)
            {
                ret->SetItem(0, trueStr, flag);
                ret->SetItem(1, falseStr, flag);
            }
        }
        else if (kind == LocaleDataKind::Calendar)
        {
            ScopedUEnumeration calendars(ucal_getKeywordValuesForLocale("calendar", localeID, false, &status));
            ret = library->CreateArray(uenum_count(calendars, &status));
            ICU_ASSERT(status, true);

            int calendarLen = 0;
            const char *calendar = nullptr;
            int i = 0;
            for (calendar = uenum_next(calendars, &calendarLen, &status); calendar != nullptr; calendar = uenum_next(calendars, &calendarLen, &status))
            {
                ICU_ASSERT(status, calendar != nullptr && calendarLen > 0);

                // OS#17172584: OOM during uloc_toUnicodeLocaleType can make this return nullptr even for known calendars
                const char *unicodeCalendar = ThrowOOMIfNull(uloc_toUnicodeLocaleType("calendar", calendar));
                const size_t unicodeCalendarLen = strlen(unicodeCalendar);

                // we only need strlen(unicodeCalendar) + 1 char16s because unicodeCalendar will always be ASCII (funnily enough)
                char16 *unicodeCalendar16 = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), char16, strlen(unicodeCalendar) + 1);
                charcount_t unicodeCalendar16Len = 0;
                HRESULT hr = utf8::NarrowStringToWideNoAlloc(
                    unicodeCalendar,
                    unicodeCalendarLen,
                    unicodeCalendar16,
                    unicodeCalendarLen + 1,
                    &unicodeCalendar16Len
                );
                AssertOrFailFastMsg(
                    hr == S_OK && unicodeCalendar16Len == unicodeCalendarLen && unicodeCalendar16Len < MaxCharCount,
                    "Unicode calendar char16 conversion was unsuccessful"
                );
                ret->SetItem(i, JavascriptString::NewWithBuffer(
                    unicodeCalendar16,
                    static_cast<charcount_t>(unicodeCalendar16Len),
                    scriptContext
                ), flag);
                i++;
            }
        }
        else if (kind == LocaleDataKind::NumberingSystem)
        {
            // unumsys_openAvailableNames has multiple bugs (http://bugs.icu-project.org/trac/ticket/11908) and also
            // does not provide a locale-specific set of numbering systems
            // the Intl spec provides a list of required numbering systems to support in #table-numbering-system-digits
            // For now, assume that all of those numbering systems are supported, and just get the default using unumsys_open
            // unumsys_open will also ensure that "native", "traditio", and "finance" are not returned, as per #sec-intl.datetimeformat-internal-slots
            ScopedUNumberingSystem numsys(unumsys_open(localeID, &status));
            ICU_ASSERT(status, true);
            utf8::NarrowToWide numsysName(unumsys_getName(numsys));

            // NOTE: update the initial array length if the list of available numbering systems changes in the future!
            ret = library->CreateArray(22);
            int i = 0;
            ret->SetItem(i++, JavascriptString::NewCopySz(numsysName, scriptContext), flag);

            // It doesn't matter that item 0 will be in the array twice (aside for size), because item 0 is the
            // preferred numbering system for the given locale, so it has precedence over everything else
            ret->SetItem(i++, library->GetIntlNumsysArabString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysArabextString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysBaliString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysBengString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysDevaString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysFullwideString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysGujrString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysGuruString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysHanidecString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysKhmrString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysKndaString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysLaooString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysLatnString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysLimbString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysMlymString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysMongString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysMymrString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysOryaString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysTamldecString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysTeluString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysThaiString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysTibtString(), flag);
        }
        else if (kind == LocaleDataKind::HourCycle)
        {
            // #sec-intl.datetimeformat-internal-slots: "[[LocaleData]][locale].hc must be < null, h11, h12, h23, h24 > for all locale values"
            ret = library->CreateArray(5);
            int i = 0;
            ret->SetItem(i++, library->GetNull(), flag);
            ret->SetItem(i++, library->GetIntlHourCycle11String(), flag);
            ret->SetItem(i++, library->GetIntlHourCycle12String(), flag);
            ret->SetItem(i++, library->GetIntlHourCycle23String(), flag);
            ret->SetItem(i++, library->GetIntlHourCycle24String(), flag);
        }
        else
        {
            AssertOrFailFastMsg(false, "GetLocaleData called with unknown kind parameter");
        }

        return ret;
#else
        AssertOrFailFastMsg(false, "Intl with Windows Globalization should never call GetLocaleData");
        return nullptr;
#endif
    }